

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O0

void __thiscall ncnn::Convolution_x86_avx512::destroy_pipeline(Convolution_x86_avx512 *this)

{
  Option *in_stack_00000028;
  Convolution_x86_avx512 *in_stack_00000030;
  
  destroy_pipeline(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

int Convolution_x86_avx512::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (convolution_dilation1)
    {
        convolution_dilation1->destroy_pipeline(opt);
        delete convolution_dilation1;
        convolution_dilation1 = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}